

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

void gen_h4grams(uint8_t *mem,uint64_t size,TrigramCallback *cb)

{
  ulong in_RSI;
  long in_RDI;
  uint64_t offset;
  uint32_t gram4;
  ulong uVar1;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar2;
  
  if (3 < in_RSI) {
    uVar2 = 0;
    for (uVar1 = 0; uVar1 < in_RSI; uVar1 = uVar1 + 1) {
      uVar2 = uVar2 << 8 | (uint)*(byte *)(in_RDI + uVar1);
      if (2 < uVar1) {
        std::function<void_(unsigned_int)>::operator()
                  ((function<void_(unsigned_int)> *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),
                   (uint)(uVar1 >> 0x20));
      }
    }
  }
  return;
}

Assistant:

void gen_h4grams(const uint8_t *mem, uint64_t size, const TrigramCallback &cb) {
    if (size < 4) {
        return;
    }

    uint32_t gram4 = 0;

    for (uint64_t offset = 0; offset < size; offset++) {
        gram4 = ((gram4 & 0xFFFFFFU) << 8U) | mem[offset];

        if (offset >= 3) {
            cb(((gram4 >> 8U) & 0xFFFFFFU) ^ (gram4 & 0xFFFFFFU));
        }
    }
}